

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.h
# Opt level: O0

Polynomial<double> * __thiscall
gmath::Polynomial<double>::operator=(Polynomial<double> *this,Polynomial<double> *p)

{
  int iVar1;
  int iVar2;
  Polynomial<double> *in_RSI;
  Polynomial<double> *in_RDI;
  Polynomial<double> *unaff_retaddr;
  Polynomial<double> *pPVar3;
  
  pPVar3 = in_RDI;
  getDegree(in_RSI);
  increase(unaff_retaddr,(int)((ulong)pPVar3 >> 0x20));
  in_RDI->used = 0;
  while( true ) {
    iVar1 = in_RDI->used;
    iVar2 = getDegree(in_RSI);
    if (iVar2 < iVar1) break;
    in_RDI->c[in_RDI->used] = in_RSI->c[in_RDI->used];
    in_RDI->used = in_RDI->used + 1;
  }
  return in_RDI;
}

Assistant:

Polynomial<T> &operator=(const Polynomial<T> &p)
    {
      increase(p.getDegree()+1);

      for (used=0; used<=p.getDegree(); used++)
      {
        c[used]=p.c[used];
      }

      return *this;
    }